

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageColorTint(Image *image,Color color)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  ulong uVar15;
  Image image_00;
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [16];
  Color *pCVar19;
  undefined8 unaff_RBP;
  long lVar20;
  Color *pCVar21;
  ulong uVar22;
  undefined8 unaff_R14;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  short sVar28;
  int iVar29;
  Color CVar31;
  int iVar34;
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined8 unaff_retaddr;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 uVar30;
  undefined6 uVar32;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_RBP;
    image_00.data = (void *)unaff_R14;
    image_00._16_8_ = unaff_retaddr;
    pCVar19 = LoadImageColors(image_00);
    auVar18 = _DAT_00164bf0;
    iVar1 = image->height;
    if (0 < (long)iVar1) {
      uVar22 = (ulong)color._0_2_ & 0xffffffffffff00ff;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar22;
      auVar9[0xc] = color.a;
      auVar10[8] = color.b;
      auVar10._0_8_ = uVar22;
      auVar10[9] = 0;
      auVar10._10_3_ = auVar9._10_3_;
      auVar16._5_8_ = 0;
      auVar16._0_5_ = auVar10._8_5_;
      auVar11[4] = color.g;
      auVar11._0_4_ = (int)uVar22;
      auVar11[5] = 0;
      auVar11._6_7_ = SUB137(auVar16 << 0x40,6);
      auVar23._0_4_ = (float)(int)uVar22;
      auVar23._4_4_ = (float)auVar11._4_4_;
      auVar23._8_4_ = (float)auVar10._8_4_;
      auVar23._12_4_ = (float)(uint3)(auVar9._10_3_ >> 0x10);
      auVar23 = divps(auVar23,_DAT_00164bf0);
      uVar2 = image->width;
      lVar20 = 0;
      fVar24 = (float)DAT_00164bf0;
      fVar25 = DAT_00164bf0._4_4_;
      fVar26 = DAT_00164bf0._8_4_;
      fVar27 = DAT_00164bf0._12_4_;
      pCVar21 = pCVar19;
      do {
        if (0 < (int)uVar2) {
          uVar22 = 0;
          do {
            CVar31 = pCVar21[uVar22];
            uVar15 = (ulong)CVar31._0_2_ & 0xffffffffffff00ff;
            auVar12._8_4_ = 0;
            auVar12._0_8_ = uVar15;
            auVar12[0xc] = CVar31.a;
            auVar13[8] = CVar31.b;
            auVar13._0_8_ = uVar15;
            auVar13[9] = 0;
            auVar13._10_3_ = auVar12._10_3_;
            auVar17._5_8_ = 0;
            auVar17._0_5_ = auVar13._8_5_;
            auVar14[4] = CVar31.g;
            auVar14._0_4_ = (int)uVar15;
            auVar14[5] = 0;
            auVar14._6_7_ = SUB137(auVar17 << 0x40,6);
            auVar33._0_4_ = (float)(int)uVar15;
            auVar33._4_4_ = (float)auVar14._4_4_;
            auVar33._8_4_ = (float)auVar13._8_4_;
            auVar33._12_4_ = (float)(uint3)(auVar12._10_3_ >> 0x10);
            auVar33 = divps(auVar33,auVar18);
            iVar29 = (int)(auVar33._0_4_ * auVar23._0_4_ * fVar24);
            iVar34 = (int)(auVar33._4_4_ * auVar23._4_4_ * fVar25);
            iVar35 = (int)(auVar33._8_4_ * auVar23._8_4_ * fVar26);
            iVar36 = (int)(auVar33._12_4_ * auVar23._12_4_ * fVar27);
            sVar7 = (short)iVar29;
            cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar29 - (0xff < sVar7);
            sVar7 = (short)((uint)iVar29 >> 0x10);
            sVar28 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar29 >> 0x10) -
                              (0xff < sVar7),cVar3);
            sVar7 = (short)iVar34;
            cVar4 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar34 - (0xff < sVar7);
            sVar7 = (short)((uint)iVar34 >> 0x10);
            uVar30 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar34 >> 0x10) -
                              (0xff < sVar7),CONCAT12(cVar4,sVar28));
            sVar7 = (short)iVar35;
            cVar5 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar35 - (0xff < sVar7);
            sVar7 = (short)((uint)iVar35 >> 0x10);
            uVar32 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar35 >> 0x10) -
                              (0xff < sVar7),CONCAT14(cVar5,uVar30));
            sVar7 = (short)iVar36;
            cVar6 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar36 - (0xff < sVar7);
            sVar8 = (short)((uint)iVar36 >> 0x10);
            sVar7 = (short)((uint)uVar30 >> 0x10);
            CVar31.g = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
            CVar31.r = (0 < sVar28) * (sVar28 < 0x100) * cVar3 - (0xff < sVar28);
            sVar7 = (short)((uint6)uVar32 >> 0x20);
            CVar31.b = (0 < sVar7) * (sVar7 < 0x100) * cVar5 - (0xff < sVar7);
            sVar7 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar36 >> 0x10) -
                                     (0xff < sVar8),CONCAT16(cVar6,uVar32)) >> 0x30);
            CVar31.a = (0 < sVar7) * (sVar7 < 0x100) * cVar6 - (0xff < sVar7);
            pCVar21[uVar22] = CVar31;
            uVar22 = uVar22 + 1;
          } while (uVar2 != uVar22);
        }
        lVar20 = lVar20 + 1;
        pCVar21 = pCVar21 + uVar2;
      } while (lVar20 != iVar1);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pCVar19;
    image->format = 7;
    ImageFormat(image,iVar1);
    return;
  }
  return;
}

Assistant:

void ImageColorTint(Image *image, Color color)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    float cR = (float)color.r/255;
    float cG = (float)color.g/255;
    float cB = (float)color.b/255;
    float cA = (float)color.a/255;

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int index = y*image->width + x;
            unsigned char r = (unsigned char)(((float)pixels[index].r/255*cR)*255.0f);
            unsigned char g = (unsigned char)(((float)pixels[index].g/255*cG)*255.0f);
            unsigned char b = (unsigned char)(((float)pixels[index].b/255*cB)*255.0f);
            unsigned char a = (unsigned char)(((float)pixels[index].a/255*cA)*255.0f);

            pixels[y*image->width + x].r = r;
            pixels[y*image->width + x].g = g;
            pixels[y*image->width + x].b = b;
            pixels[y*image->width + x].a = a;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}